

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ugui_sdl.c
# Opt level: O0

int ugui_sdl_get_event(ugui_sdl_t *sdl_ctx)

{
  int iVar1;
  int local_50 [2];
  SDL_Event event;
  ugui_sdl_t *sdl_ctx_local;
  
  event._48_8_ = sdl_ctx;
  while( true ) {
    do {
      iVar1 = SDL_PollEvent(local_50);
      if (iVar1 == 0) {
        return 0;
      }
      if (local_50[0] == 0x100) {
        return 7;
      }
    } while (local_50[0] != 0x300);
    if ((event.motion.which == 0x1b) || (event.motion.which == 0x71)) {
      return 7;
    }
    if (event.motion.which == 0x4000004f) {
      return 4;
    }
    if (event.motion.which == 0x40000050) break;
    if (event.motion.which == 0x40000051) {
      return 2;
    }
    if (event.motion.which == 0x40000052) {
      return 1;
    }
  }
  return 3;
}

Assistant:

int ugui_sdl_get_event(ugui_sdl_t* sdl_ctx) {
	//Handle SDL events
	SDL_Event event;
	while (SDL_PollEvent(&event)) {
		if (event.type == SDL_QUIT) {
			return UGUI_EVT_EXIT;
		}
		if (event.type == SDL_KEYDOWN) {
			switch (event.key.keysym.sym) {
			case SDLK_UP:
				return UGUI_EVT_UP;
			case SDLK_DOWN:
				return UGUI_EVT_DOWN;
			case SDLK_LEFT:
				return UGUI_EVT_LEFT;
			case SDLK_RIGHT:
				return UGUI_EVT_RIGHT;
			case SDLK_ESCAPE:
			case SDLK_q:
				return UGUI_EVT_EXIT;
			}
		}
	}
	return UGUI_EVT_NONE;
}